

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

fdb_status
fdb_get_latency_stats(fdb_file_handle *fhandle,fdb_latency_stat *stat,fdb_latency_stat_type type)

{
  fdb_latency_stat_type type_local;
  fdb_latency_stat *stat_local;
  fdb_file_handle *fhandle_local;
  fdb_status local_4;
  
  if ((fhandle == (fdb_file_handle *)0x0) || (fhandle->root == (fdb_kvs_handle *)0x0)) {
    local_4 = FDB_RESULT_INVALID_HANDLE;
  }
  else if ((stat == (fdb_latency_stat *)0x0) || (0x12 < type)) {
    local_4 = FDB_RESULT_INVALID_ARGS;
  }
  else if (fhandle->root->file == (filemgr *)0x0) {
    local_4 = FDB_RESULT_FILE_NOT_OPEN;
  }
  else {
    local_4 = FDB_RESULT_SUCCESS;
  }
  return local_4;
}

Assistant:

LIBFDB_API
fdb_status fdb_get_latency_stats(fdb_file_handle *fhandle,
                                 fdb_latency_stat *stat,
                                 fdb_latency_stat_type type)
{
    if (!fhandle || !fhandle->root) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!stat || type >= FDB_LATENCY_NUM_STATS) {
        return FDB_RESULT_INVALID_ARGS;
    }

    if (!fhandle->root->file) {
        return FDB_RESULT_FILE_NOT_OPEN;
    }

#ifdef _LATENCY_STATS
    filemgr_get_latency_stat(fhandle->root->file, type, stat);
#endif // _LATENCY_STATS

    return FDB_RESULT_SUCCESS;
}